

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xpathInternals(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  undefined8 uVar72;
  xmlXPathObjectPtr pxVar73;
  FILE *pFVar74;
  xmlXPathObjectPtr pxVar75;
  xmlNodePtr pxVar76;
  xmlNodePtr pxVar77;
  long lVar78;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int nr_19;
  int nr_20;
  int nr_21;
  int nr_22;
  undefined8 uVar79;
  int n_depth_1;
  int iVar80;
  xmlXPathObjectPtr pxVar81;
  int n_value;
  uint uVar82;
  uint uVar83;
  int iVar84;
  undefined4 uVar85;
  xmlXPathObjectPtr in_RSI;
  ulong uVar86;
  bool bVar87;
  int test_ret_2;
  undefined4 *puVar88;
  ulong uVar89;
  int n_depth;
  int iVar90;
  uint *puVar91;
  undefined8 *puVar92;
  int test_ret_9;
  int test_ret;
  int test_ret_1;
  int test_ret_12;
  int test_ret_25;
  int local_50;
  int local_4c;
  undefined8 local_48;
  uint local_40;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing xpathInternals : 106 of 117 functions ...");
  }
  iVar2 = xmlMemBlocks();
  uVar72 = valuePop(0);
  xmlXPathFreeObject(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in valuePop");
    in_RSI = (xmlXPathObjectPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar82 = 0;
  local_50 = 0;
  do {
    iVar5 = (int)in_RSI;
    iVar4 = xmlMemBlocks();
    pxVar73 = gen_xmlXPathObjectPtr(uVar82,iVar5);
    in_RSI = pxVar73;
    valuePush(0);
    call_tests = call_tests + 1;
    if (pxVar73 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar73);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in valuePush",(ulong)(uint)(iVar5 - iVar4));
      local_50 = local_50 + 1;
      printf(" %d",0);
      in_RSI = (xmlXPathObjectPtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlXPathAddValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathAddValues",(ulong)(uint)(iVar6 - iVar4));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    xmlXPathBooleanFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathBooleanFunction",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    xmlXPathCeilingFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCeilingFunction",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar82 = 0;
  do {
    puVar88 = &DAT_00158240;
    uVar83 = 0;
    do {
      iVar9 = xmlMemBlocks();
      uVar85 = 0xffffffff;
      if (uVar82 < 4) {
        uVar85 = (&DAT_00158240)[uVar82];
      }
      xmlXPathCompareValues(0,uVar85,*puVar88);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathCompareValues",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar82);
        printf(" %d",(ulong)uVar83);
        putchar(10);
      }
      uVar83 = uVar83 + 1;
      puVar88 = puVar88 + 1;
    } while (uVar83 != 4);
    uVar82 = uVar82 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    xmlXPathConcatFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConcatFunction",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    xmlXPathContainsFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathContainsFunction",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar11 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    xmlXPathCountFunction(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCountFunction",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 4);
  function_tests = function_tests + 1;
  iVar11 = 0;
  local_48 = 0;
  bVar1 = true;
  do {
    bVar87 = bVar1;
    puVar88 = &DAT_00158240;
    uVar82 = 0;
    do {
      iVar13 = xmlMemBlocks();
      if (bVar87) {
        pFVar74 = fopen64("test.out","a+");
      }
      else {
        pFVar74 = (FILE *)0x0;
      }
      pxVar73 = (xmlXPathObjectPtr)0x0;
      xmlXPathDebugDumpCompExpr(pFVar74,0,*puVar88);
      call_tests = call_tests + 1;
      if (pFVar74 != (FILE *)0x0) {
        fclose(pFVar74);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathDebugDumpCompExpr",(ulong)(uint)(iVar14 - iVar13)
              );
        iVar11 = iVar11 + 1;
        printf(" %d",local_48);
        printf(" %d",0);
        pxVar73 = (xmlXPathObjectPtr)(ulong)uVar82;
        printf(" %d");
        putchar(10);
      }
      uVar82 = uVar82 + 1;
      puVar88 = puVar88 + 1;
    } while (uVar82 != 4);
    local_48 = 1;
    bVar1 = false;
  } while (bVar87);
  function_tests = function_tests + 1;
  local_4c = 0;
  local_40 = 0;
  bVar1 = true;
  do {
    bVar87 = bVar1;
    uVar82 = 0;
    do {
      puVar88 = &DAT_00158240;
      pxVar81 = (xmlXPathObjectPtr)0x0;
      do {
        iVar14 = (int)pxVar73;
        iVar13 = xmlMemBlocks();
        if (bVar87) {
          iVar14 = 0x14caad;
          pFVar74 = fopen64("test.out","a+");
        }
        else {
          pFVar74 = (FILE *)0x0;
        }
        pxVar75 = gen_xmlXPathObjectPtr(uVar82,iVar14);
        pxVar73 = pxVar75;
        xmlXPathDebugDumpObject(pFVar74,pxVar75,*puVar88);
        call_tests = call_tests + 1;
        if (pFVar74 != (FILE *)0x0) {
          fclose(pFVar74);
        }
        if (pxVar75 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(pxVar75);
        }
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        iVar15 = (int)pxVar81;
        if (iVar13 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathDebugDumpObject",(ulong)(uint)(iVar14 - iVar13)
                );
          local_4c = local_4c + 1;
          printf(" %d",(ulong)local_40);
          printf(" %d",(ulong)uVar82);
          printf(" %d");
          putchar(10);
          pxVar73 = pxVar81;
        }
        uVar83 = iVar15 + 1;
        pxVar81 = (xmlXPathObjectPtr)(ulong)uVar83;
        puVar88 = puVar88 + 1;
      } while (uVar83 != 4);
      uVar82 = uVar82 + 1;
    } while (uVar82 != 5);
    local_40 = 1;
    bVar1 = false;
  } while (bVar87);
  function_tests = function_tests + 1;
  iVar2 = local_50 + (uint)(iVar2 != iVar3) + (uint)(iVar4 != iVar5) + iVar6 + iVar7 + iVar8 + iVar9
          + iVar10 + iVar12 + iVar11 + local_4c;
  iVar3 = xmlMemBlocks();
  uVar72 = xmlXPathDifference(0,0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDifference",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  uVar72 = xmlXPathDistinct(0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDistinct",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  uVar72 = xmlXPathDistinctSorted(0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDistinctSorted",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlXPathDivValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    iVar11 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDivValues",(ulong)(uint)(iVar11 - iVar9));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  xmlXPathEqualValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar11 != iVar12) {
    iVar13 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathEqualValues",(ulong)(uint)(iVar13 - iVar11));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar91 = &DAT_00158240;
  pxVar73 = (xmlXPathObjectPtr)0x0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    pxVar81 = (xmlXPathObjectPtr)(ulong)*puVar91;
    xmlXPathErr(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    iVar90 = (int)pxVar73;
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathErr",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
      pxVar81 = pxVar73;
    }
    uVar82 = iVar90 + 1;
    pxVar73 = (xmlXPathObjectPtr)(ulong)uVar82;
    puVar91 = puVar91 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  xmlXPathEvalExpr(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathEvalExpr");
    pxVar81 = (xmlXPathObjectPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar90 = 0;
  do {
    iVar17 = (int)pxVar81;
    iVar16 = xmlMemBlocks();
    pxVar73 = gen_xmlXPathObjectPtr(uVar82,iVar17);
    pxVar81 = pxVar73;
    xmlXPathEvaluatePredicateResult(0);
    call_tests = call_tests + 1;
    if (pxVar73 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar73);
    }
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEvaluatePredicateResult",
             (ulong)(uint)(iVar17 - iVar16));
      iVar90 = iVar90 + 1;
      printf(" %d",0);
      pxVar81 = (xmlXPathObjectPtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    xmlXPathFalseFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathFalseFunction",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    xmlXPathFloorFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathFloorFunction",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar18 = xmlMemBlocks();
  xmlXPathHasSameNodes(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar19 = xmlMemBlocks();
  if (iVar18 != iVar19) {
    iVar20 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathHasSameNodes",(ulong)(uint)(iVar20 - iVar18));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar20 = 0;
  do {
    iVar21 = xmlMemBlocks();
    xmlXPathIdFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIdFunction",(ulong)(uint)(iVar22 - iVar21));
      iVar20 = iVar20 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  uVar72 = xmlXPathIntersection(0,0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar22 = xmlMemBlocks();
  if (iVar21 != iVar22) {
    iVar23 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathIntersection",(ulong)(uint)(iVar23 - iVar21));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar92 = &DAT_0015ad60;
  uVar82 = 0;
  iVar23 = 0;
  do {
    iVar24 = xmlMemBlocks();
    if (uVar82 < 4) {
      uVar72 = *puVar92;
    }
    else {
      uVar72 = 0;
    }
    xmlXPathIsNodeType(uVar72);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar25 = xmlMemBlocks();
    if (iVar24 != iVar25) {
      iVar25 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIsNodeType",(ulong)(uint)(iVar25 - iVar24));
      iVar23 = iVar23 + 1;
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar92 = puVar92 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar24 = 0;
  do {
    iVar25 = xmlMemBlocks();
    xmlXPathLangFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar26 = xmlMemBlocks();
    if (iVar25 != iVar26) {
      iVar26 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathLangFunction",(ulong)(uint)(iVar26 - iVar25));
      iVar24 = iVar24 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar25 = 0;
  do {
    iVar26 = xmlMemBlocks();
    xmlXPathLastFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathLastFunction",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar26 = xmlMemBlocks();
  uVar72 = xmlXPathLeading(0,0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar27 = xmlMemBlocks();
  if (iVar26 != iVar27) {
    iVar28 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathLeading",(ulong)(uint)(iVar28 - iVar26));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar28 = xmlMemBlocks();
  uVar72 = xmlXPathLeadingSorted(0,0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar29 = xmlMemBlocks();
  if (iVar28 != iVar29) {
    iVar30 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathLeadingSorted",(ulong)(uint)(iVar30 - iVar28));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar30 = 0;
  do {
    iVar31 = xmlMemBlocks();
    xmlXPathLocalNameFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathLocalNameFunction",(ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar31 = xmlMemBlocks();
  xmlXPathModValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar32 = xmlMemBlocks();
  if (iVar31 != iVar32) {
    iVar33 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathModValues",(ulong)(uint)(iVar33 - iVar31));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar33 = xmlMemBlocks();
  xmlXPathMultValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar34 = xmlMemBlocks();
  if (iVar33 != iVar34) {
    iVar35 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathMultValues",(ulong)(uint)(iVar35 - iVar33));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar91 = &DAT_00158240;
  uVar82 = 0;
  iVar35 = 0;
  do {
    iVar36 = xmlMemBlocks();
    pxVar76 = (xmlNodePtr)(ulong)*puVar91;
    xmlXPathNamespaceURIFunction(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar37 = xmlMemBlocks();
    if (iVar36 != iVar37) {
      iVar37 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNamespaceURIFunction",
             (ulong)(uint)(iVar37 - iVar36));
      iVar35 = iVar35 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar91 = puVar91 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar36 = 0;
  do {
    iVar37 = xmlMemBlocks();
    uVar72 = xmlXPathNewBoolean(*puVar88);
    xmlXPathFreeObject(uVar72);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar38 = xmlMemBlocks();
    if (iVar37 != iVar38) {
      iVar38 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewBoolean",(ulong)(uint)(iVar38 - iVar37));
      iVar36 = iVar36 + 1;
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar92 = &DAT_0015ad48;
  uVar82 = 0;
  iVar37 = 0;
  do {
    iVar38 = xmlMemBlocks();
    if (uVar82 < 3) {
      uVar72 = *puVar92;
    }
    else {
      uVar72 = 0;
    }
    xmlXPathNewCString(uVar72);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar39 = xmlMemBlocks();
    if (iVar38 != iVar39) {
      iVar39 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewCString",(ulong)(uint)(iVar39 - iVar38));
      iVar37 = iVar37 + 1;
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar92 = puVar92 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar38 = 0;
  do {
    iVar39 = xmlMemBlocks();
    if (uVar82 == 0) {
      uVar72 = 0;
    }
    else {
      uVar72 = _xmlXPathNAN;
      if (uVar82 != 2) {
        if (uVar82 == 1) {
          uVar72 = 0xbff199999999999a;
        }
        else {
          uVar72 = 0xbff0000000000000;
        }
      }
    }
    uVar72 = xmlXPathNewFloat(uVar72);
    xmlXPathFreeObject(uVar72);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar40 = xmlMemBlocks();
    if (iVar39 != iVar40) {
      iVar40 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewFloat",(ulong)(uint)(iVar40 - iVar39));
      iVar38 = iVar38 + 1;
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar39 = 0;
  do {
    iVar41 = (int)pxVar76;
    iVar40 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar41);
    uVar72 = xmlXPathNewNodeSet(pxVar76);
    xmlXPathFreeObject(uVar72);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr);
    xmlResetLastError();
    iVar41 = xmlMemBlocks();
    if (iVar40 != iVar41) {
      iVar41 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewNodeSet",(ulong)(uint)(iVar41 - iVar40));
      iVar39 = iVar39 + 1;
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  iVar40 = xmlMemBlocks();
  uVar72 = xmlXPathNewNodeSetList(0);
  xmlXPathFreeObject(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar41 = xmlMemBlocks();
  if (iVar40 != iVar41) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNewNodeSetList");
    pxVar76 = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar92 = &DAT_0015ad60;
  uVar82 = 0;
  iVar80 = 0;
  do {
    iVar42 = xmlMemBlocks();
    if (uVar82 < 4) {
      uVar72 = *puVar92;
    }
    else {
      uVar72 = 0;
    }
    xmlXPathNewString(uVar72);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar43 = xmlMemBlocks();
    if (iVar42 != iVar43) {
      iVar43 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewString",(ulong)(uint)(iVar43 - iVar42));
      iVar80 = iVar80 + 1;
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar92 = puVar92 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar42 = 0;
  do {
    iVar44 = (int)pxVar76;
    iVar43 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar44);
    pxVar77 = (xmlNodePtr)xmlXPathNextAncestor(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_00);
    xmlResetLastError();
    iVar44 = xmlMemBlocks();
    if (iVar43 != iVar44) {
      iVar44 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextAncestor",(ulong)(uint)(iVar44 - iVar43));
      iVar42 = iVar42 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar43 = 0;
  do {
    iVar45 = (int)pxVar76;
    iVar44 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar45);
    pxVar77 = (xmlNodePtr)xmlXPathNextAncestorOrSelf(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_01);
    xmlResetLastError();
    iVar45 = xmlMemBlocks();
    if (iVar44 != iVar45) {
      iVar45 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextAncestorOrSelf",(ulong)(uint)(iVar45 - iVar44))
      ;
      iVar43 = iVar43 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar44 = 0;
  do {
    iVar46 = (int)pxVar76;
    iVar45 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar46);
    pxVar77 = (xmlNodePtr)xmlXPathNextAttribute(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_02);
    xmlResetLastError();
    iVar46 = xmlMemBlocks();
    if (iVar45 != iVar46) {
      iVar46 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextAttribute",(ulong)(uint)(iVar46 - iVar45));
      iVar44 = iVar44 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar45 = 0;
  do {
    iVar47 = (int)pxVar76;
    iVar46 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar47);
    pxVar77 = (xmlNodePtr)xmlXPathNextChild(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_03);
    xmlResetLastError();
    iVar47 = xmlMemBlocks();
    if (iVar46 != iVar47) {
      iVar47 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextChild",(ulong)(uint)(iVar47 - iVar46));
      iVar45 = iVar45 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar46 = 0;
  do {
    iVar48 = (int)pxVar76;
    iVar47 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar48);
    pxVar77 = (xmlNodePtr)xmlXPathNextDescendant(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_04);
    xmlResetLastError();
    iVar48 = xmlMemBlocks();
    if (iVar47 != iVar48) {
      iVar48 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextDescendant",(ulong)(uint)(iVar48 - iVar47));
      iVar46 = iVar46 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar47 = 0;
  do {
    iVar49 = (int)pxVar76;
    iVar48 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar49);
    pxVar77 = (xmlNodePtr)xmlXPathNextDescendantOrSelf(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_05);
    xmlResetLastError();
    iVar49 = xmlMemBlocks();
    if (iVar48 != iVar49) {
      iVar49 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextDescendantOrSelf",
             (ulong)(uint)(iVar49 - iVar48));
      iVar47 = iVar47 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar48 = 0;
  do {
    iVar50 = (int)pxVar76;
    iVar49 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar50);
    pxVar77 = (xmlNodePtr)xmlXPathNextFollowing(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_06);
    xmlResetLastError();
    iVar50 = xmlMemBlocks();
    if (iVar49 != iVar50) {
      iVar50 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextFollowing",(ulong)(uint)(iVar50 - iVar49));
      iVar48 = iVar48 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar49 = 0;
  do {
    iVar51 = (int)pxVar76;
    iVar50 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar51);
    pxVar77 = (xmlNodePtr)xmlXPathNextFollowingSibling(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_07);
    xmlResetLastError();
    iVar51 = xmlMemBlocks();
    if (iVar50 != iVar51) {
      iVar51 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextFollowingSibling",
             (ulong)(uint)(iVar51 - iVar50));
      iVar49 = iVar49 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar50 = 0;
  do {
    iVar52 = (int)pxVar76;
    iVar51 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar52);
    pxVar77 = (xmlNodePtr)xmlXPathNextNamespace(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_08);
    xmlResetLastError();
    iVar52 = xmlMemBlocks();
    if (iVar51 != iVar52) {
      iVar52 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextNamespace",(ulong)(uint)(iVar52 - iVar51));
      iVar50 = iVar50 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar51 = 0;
  do {
    iVar53 = (int)pxVar76;
    iVar52 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar53);
    pxVar77 = (xmlNodePtr)xmlXPathNextParent(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_09);
    xmlResetLastError();
    iVar53 = xmlMemBlocks();
    if (iVar52 != iVar53) {
      iVar53 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextParent",(ulong)(uint)(iVar53 - iVar52));
      iVar51 = iVar51 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar52 = 0;
  do {
    iVar54 = (int)pxVar76;
    iVar53 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar54);
    pxVar77 = (xmlNodePtr)xmlXPathNextPreceding(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_10);
    xmlResetLastError();
    iVar54 = xmlMemBlocks();
    if (iVar53 != iVar54) {
      iVar54 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextPreceding",(ulong)(uint)(iVar54 - iVar53));
      iVar52 = iVar52 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar53 = 0;
  do {
    iVar55 = (int)pxVar76;
    iVar54 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar55);
    pxVar77 = (xmlNodePtr)xmlXPathNextPrecedingSibling(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_11);
    xmlResetLastError();
    iVar55 = xmlMemBlocks();
    if (iVar54 != iVar55) {
      iVar55 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextPrecedingSibling",
             (ulong)(uint)(iVar55 - iVar54));
      iVar53 = iVar53 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar54 = 0;
  do {
    iVar56 = (int)pxVar76;
    iVar55 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar56);
    pxVar77 = (xmlNodePtr)xmlXPathNextSelf(0,pxVar76);
    desret_xmlNodePtr(pxVar77);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_12);
    xmlResetLastError();
    iVar56 = xmlMemBlocks();
    if (iVar55 != iVar56) {
      iVar56 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextSelf",(ulong)(uint)(iVar56 - iVar55));
      iVar54 = iVar54 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar55 = 0;
  do {
    iVar57 = (int)pxVar76;
    iVar56 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar57);
    uVar72 = xmlXPathNodeLeading(0,pxVar76);
    xmlXPathFreeNodeSet(uVar72);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_13);
    xmlResetLastError();
    iVar57 = xmlMemBlocks();
    if (iVar56 != iVar57) {
      iVar57 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeLeading",(ulong)(uint)(iVar57 - iVar56));
      iVar55 = iVar55 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  local_40 = 0;
  do {
    iVar57 = (int)pxVar76;
    iVar56 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar57);
    uVar72 = xmlXPathNodeLeadingSorted(0,pxVar76);
    xmlXPathFreeNodeSet(uVar72);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_14);
    xmlResetLastError();
    iVar57 = xmlMemBlocks();
    if (iVar56 != iVar57) {
      iVar57 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeLeadingSorted",(ulong)(uint)(iVar57 - iVar56));
      local_40 = local_40 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  local_4c = 0;
  do {
    iVar57 = (int)pxVar76;
    iVar56 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar57);
    xmlXPathNodeSetAdd(0,pxVar76);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_15);
    xmlResetLastError();
    iVar57 = xmlMemBlocks();
    if (iVar56 != iVar57) {
      iVar57 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetAdd",(ulong)(uint)(iVar57 - iVar56));
      local_4c = local_4c + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  iVar56 = 0;
  uVar82 = 0;
  do {
    pxVar77 = (xmlNodePtr)0x0;
    bVar1 = true;
    do {
      bVar87 = bVar1;
      iVar58 = (int)pxVar76;
      iVar57 = xmlMemBlocks();
      pxVar76 = gen_xmlNodePtr(uVar82,iVar58);
      if (bVar87) {
        get_api_root();
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
        }
        xmlXPathNodeSetAddNs(0,pxVar76,api_ns);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar82,pxVar76,nr_17);
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      else {
        xmlXPathNodeSetAddNs(0,pxVar76,0);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar82,pxVar76,nr_16);
      }
      xmlResetLastError();
      iVar58 = xmlMemBlocks();
      if (iVar57 != iVar58) {
        iVar58 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetAddNs",(ulong)(uint)(iVar58 - iVar57));
        iVar56 = iVar56 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar82);
        printf(" %d");
        putchar(10);
        pxVar76 = pxVar77;
      }
      pxVar77 = (xmlNodePtr)0x1;
      bVar1 = false;
    } while (bVar87);
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar57 = 0;
  do {
    iVar59 = (int)pxVar76;
    iVar58 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar59);
    xmlXPathNodeSetAddUnique(0,pxVar76);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_18);
    xmlResetLastError();
    iVar59 = xmlMemBlocks();
    if (iVar58 != iVar59) {
      iVar59 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetAddUnique",(ulong)(uint)(iVar59 - iVar58));
      iVar57 = iVar57 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  iVar2 = iVar2 + (uint)(iVar3 != iVar4) + (uint)(iVar5 != iVar6) + (uint)(iVar7 != iVar8) +
          (uint)(iVar9 != iVar10) + (uint)(iVar11 != iVar12) + iVar13 + (uint)(iVar14 != iVar15) +
          iVar90 + iVar16 + iVar17 + (uint)(iVar18 != iVar19) + iVar20 + (uint)(iVar21 != iVar22) +
          iVar23 + iVar24 + iVar25 + (uint)(iVar26 != iVar27) + (uint)(iVar28 != iVar29) + iVar30 +
          (uint)(iVar31 != iVar32) + (uint)(iVar33 != iVar34) + iVar35 + iVar36 + iVar37 +
          iVar38 + iVar39 + (uint)(iVar40 != iVar41) + iVar80 + iVar42 + iVar43 + iVar44 + iVar45 +
          iVar46 + iVar47 + iVar48 + iVar49 + iVar50 + iVar51 + iVar52 + iVar53 + iVar54 + iVar55 +
          local_40 + local_4c;
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar3 = 0;
  do {
    iVar5 = (int)pxVar76;
    iVar4 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar5);
    xmlXPathNodeSetContains(0,pxVar76);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_19);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetContains",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar4 = 0;
  do {
    iVar6 = (int)pxVar76;
    iVar5 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar6);
    xmlXPathNodeSetDel(0,pxVar76);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_20);
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetDel",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  uVar72 = xmlXPathNodeSetMerge(0,0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNodeSetMerge",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar91 = &DAT_00158240;
  uVar82 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar76 = (xmlNodePtr)(ulong)*puVar91;
    xmlXPathNodeSetRemove(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetRemove",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar91 = puVar91 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlXPathNodeSetSort(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNodeSetSort");
    pxVar76 = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar10 = 0;
  do {
    iVar12 = (int)pxVar76;
    iVar11 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar12);
    uVar72 = xmlXPathNodeTrailing(0,pxVar76);
    xmlXPathFreeNodeSet(uVar72);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_21);
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeTrailing",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar11 = 0;
  do {
    iVar13 = (int)pxVar76;
    iVar12 = xmlMemBlocks();
    pxVar76 = gen_xmlNodePtr(uVar82,iVar13);
    uVar72 = xmlXPathNodeTrailingSorted(0,pxVar76);
    xmlXPathFreeNodeSet(uVar72);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar82,pxVar76,nr_22);
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeTrailingSorted",(ulong)(uint)(iVar13 - iVar12))
      ;
      iVar11 = iVar11 + 1;
      printf(" %d",0);
      pxVar76 = (xmlNodePtr)(ulong)uVar82;
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != 3);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    xmlXPathNormalizeFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNormalizeFunction",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar13 = xmlMemBlocks();
  xmlXPathNotEqualValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar14 = xmlMemBlocks();
  if (iVar13 != iVar14) {
    iVar15 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNotEqualValues",(ulong)(uint)(iVar15 - iVar13));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar15 = 0;
  do {
    iVar90 = xmlMemBlocks();
    xmlXPathNotFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar90 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNotFunction",(ulong)(uint)(iVar16 - iVar90));
      iVar15 = iVar15 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar92 = &DAT_0015ad60;
  uVar82 = 0;
  iVar90 = 0;
  do {
    iVar16 = xmlMemBlocks();
    if (uVar82 < 4) {
      uVar72 = *puVar92;
    }
    else {
      uVar72 = 0;
    }
    xmlXPathNsLookup(0,uVar72);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNsLookup",(ulong)(uint)(iVar17 - iVar16));
      iVar90 = iVar90 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar92 = puVar92 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    xmlXPathNumberFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNumberFunction",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar17 = xmlMemBlocks();
  lVar78 = xmlXPathParseNCName(0);
  if (lVar78 != 0) {
    (*_xmlFree)(lVar78);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar18 = xmlMemBlocks();
  if (iVar17 != iVar18) {
    iVar19 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathParseNCName",(ulong)(uint)(iVar19 - iVar17));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar19 = xmlMemBlocks();
  lVar78 = xmlXPathParseName(0);
  if (lVar78 != 0) {
    (*_xmlFree)(lVar78);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar19 != iVar20) {
    iVar21 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathParseName",(ulong)(uint)(iVar21 - iVar19));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  xmlXPathPopBoolean(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar22 = xmlMemBlocks();
  if (iVar21 != iVar22) {
    iVar23 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopBoolean",(ulong)(uint)(iVar23 - iVar21));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar23 = xmlMemBlocks();
  xmlXPathPopExternal(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar24 = xmlMemBlocks();
  if (iVar23 != iVar24) {
    iVar25 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopExternal",(ulong)(uint)(iVar25 - iVar23));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar25 = xmlMemBlocks();
  uVar72 = xmlXPathPopNodeSet(0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar26 = xmlMemBlocks();
  if (iVar25 != iVar26) {
    iVar27 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopNodeSet",(ulong)(uint)(iVar27 - iVar25));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar27 = xmlMemBlocks();
  xmlXPathPopNumber(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar28 = xmlMemBlocks();
  if (iVar27 != iVar28) {
    iVar29 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopNumber",(ulong)(uint)(iVar29 - iVar27));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar29 = xmlMemBlocks();
  lVar78 = xmlXPathPopString(0);
  if (lVar78 != 0) {
    (*_xmlFree)(lVar78);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar30 = xmlMemBlocks();
  if (iVar29 != iVar30) {
    iVar31 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopString",(ulong)(uint)(iVar31 - iVar29));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar31 = 0;
  iVar32 = 0;
  do {
    iVar33 = xmlMemBlocks();
    xmlXPathPositionFunction(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar34 = xmlMemBlocks();
    if (iVar33 != iVar34) {
      iVar34 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathPositionFunction",(ulong)(uint)(iVar34 - iVar33));
      iVar32 = iVar32 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar31 = iVar31 + 1;
  } while (iVar31 != 4);
  function_tests = function_tests + 1;
  iVar31 = xmlMemBlocks();
  xmlXPathRegisterAllFunctions(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar33 = xmlMemBlocks();
  if (iVar31 != iVar33) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisterAllFunctions");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar82 = 0;
  do {
    uVar83 = 0;
    puVar92 = &DAT_0015ad60;
    do {
      iVar34 = xmlMemBlocks();
      if (uVar82 < 4) {
        uVar86 = (&DAT_0015ad60)[uVar82];
      }
      else {
        uVar86 = 0;
      }
      if (uVar83 < 4) {
        uVar72 = *puVar92;
      }
      else {
        uVar72 = 0;
      }
      xmlXPathRegisterNs(0,uVar86,uVar72);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar35 = xmlMemBlocks();
      if (iVar34 != iVar35) {
        iVar35 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathRegisterNs",(ulong)(uint)(iVar35 - iVar34));
        local_50 = local_50 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar82);
        uVar86 = (ulong)uVar83;
        printf(" %d");
        putchar(10);
      }
      uVar83 = uVar83 + 1;
      puVar92 = puVar92 + 1;
    } while (uVar83 != 5);
    uVar82 = uVar82 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  local_38 = &DAT_0015ad60;
  local_4c = 0;
  uVar89 = 0;
  do {
    uVar82 = 0;
    do {
      iVar35 = (int)uVar86;
      iVar34 = xmlMemBlocks();
      if ((uint)uVar89 < 4) {
        uVar86 = (&DAT_0015ad60)[uVar89];
      }
      else {
        uVar86 = 0;
      }
      pxVar73 = gen_xmlXPathObjectPtr(uVar82,iVar35);
      xmlXPathRegisterVariable(0,uVar86,pxVar73);
      call_tests = call_tests + 1;
      if (pxVar73 != (xmlXPathObjectPtr)0x0) {
        xmlXPathFreeObject(pxVar73);
      }
      xmlResetLastError();
      iVar35 = xmlMemBlocks();
      if (iVar34 != iVar35) {
        iVar35 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathRegisterVariable",(ulong)(uint)(iVar35 - iVar34))
        ;
        local_4c = local_4c + 1;
        printf(" %d",0);
        printf(" %d",uVar89);
        uVar86 = (ulong)uVar82;
        printf(" %d");
        putchar(10);
      }
      uVar82 = uVar82 + 1;
    } while (uVar82 != 5);
    uVar82 = (uint)uVar89 + 1;
    uVar89 = (ulong)uVar82;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar82 = 0;
  do {
    uVar89 = 0;
    do {
      uVar83 = 0;
      do {
        iVar35 = (int)uVar86;
        iVar34 = xmlMemBlocks();
        if (uVar82 < 4) {
          uVar86 = (&DAT_0015ad60)[uVar82];
        }
        else {
          uVar86 = 0;
        }
        if ((uint)uVar89 < 4) {
          uVar72 = (&DAT_0015ad60)[uVar89];
        }
        else {
          uVar72 = 0;
        }
        pxVar73 = gen_xmlXPathObjectPtr(uVar83,iVar35);
        xmlXPathRegisterVariableNS(0,uVar86,uVar72,pxVar73);
        call_tests = call_tests + 1;
        if (pxVar73 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(pxVar73);
        }
        xmlResetLastError();
        iVar35 = xmlMemBlocks();
        if (iVar34 != iVar35) {
          iVar35 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathRegisterVariableNS",
                 (ulong)(uint)(iVar35 - iVar34));
          local_40 = local_40 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar82);
          printf(" %d",uVar89);
          uVar86 = (ulong)uVar83;
          printf(" %d");
          putchar(10);
        }
        uVar83 = uVar83 + 1;
      } while (uVar83 != 5);
      uVar83 = (uint)uVar89 + 1;
      uVar89 = (ulong)uVar83;
    } while (uVar83 != 5);
    uVar82 = uVar82 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  iVar34 = xmlMemBlocks();
  xmlXPathRegisteredFuncsCleanup(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar35 = xmlMemBlocks();
  if (iVar34 != iVar35) {
    iVar36 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisteredFuncsCleanup",
           (ulong)(uint)(iVar36 - iVar34));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar36 = xmlMemBlocks();
  xmlXPathRegisteredNsCleanup(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar37 = xmlMemBlocks();
  if (iVar36 != iVar37) {
    iVar38 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisteredNsCleanup",(ulong)(uint)(iVar38 - iVar36));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar38 = xmlMemBlocks();
  xmlXPathRegisteredVariablesCleanup(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar39 = xmlMemBlocks();
  if (iVar38 != iVar39) {
    iVar40 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisteredVariablesCleanup",
           (ulong)(uint)(iVar40 - iVar38));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar40 = xmlMemBlocks();
  xmlXPathRoot(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar41 = xmlMemBlocks();
  if (iVar40 != iVar41) {
    iVar80 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRoot",(ulong)(uint)(iVar80 - iVar40));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar80 = 0;
  do {
    iVar42 = xmlMemBlocks();
    xmlXPathRoundFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar43 = xmlMemBlocks();
    if (iVar42 != iVar43) {
      iVar43 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathRoundFunction",(ulong)(uint)(iVar43 - iVar42));
      iVar80 = iVar80 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar42 = 0;
  do {
    iVar43 = xmlMemBlocks();
    xmlXPathStartsWithFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar44 = xmlMemBlocks();
    if (iVar43 != iVar44) {
      iVar44 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStartsWithFunction",(ulong)(uint)(iVar44 - iVar43))
      ;
      iVar42 = iVar42 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar43 = 0;
  do {
    iVar44 = xmlMemBlocks();
    if (uVar82 < 4) {
      uVar72 = *local_38;
    }
    else {
      uVar72 = 0;
    }
    xmlXPathStringEvalNumber(uVar72);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar45 = xmlMemBlocks();
    if (iVar44 != iVar45) {
      iVar45 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStringEvalNumber",(ulong)(uint)(iVar45 - iVar44));
      iVar43 = iVar43 + 1;
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    local_38 = local_38 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar44 = 0;
  do {
    iVar45 = xmlMemBlocks();
    xmlXPathStringFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar46 = xmlMemBlocks();
    if (iVar45 != iVar46) {
      iVar46 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStringFunction",(ulong)(uint)(iVar46 - iVar45));
      iVar44 = iVar44 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar45 = 0;
  do {
    iVar46 = xmlMemBlocks();
    xmlXPathStringLengthFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar47 = xmlMemBlocks();
    if (iVar46 != iVar47) {
      iVar47 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStringLengthFunction",
             (ulong)(uint)(iVar47 - iVar46));
      iVar45 = iVar45 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar46 = xmlMemBlocks();
  xmlXPathSubValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar47 = xmlMemBlocks();
  if (iVar46 != iVar47) {
    iVar48 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathSubValues",(ulong)(uint)(iVar48 - iVar46));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar48 = 0;
  do {
    iVar49 = xmlMemBlocks();
    xmlXPathSubstringAfterFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar50 = xmlMemBlocks();
    if (iVar49 != iVar50) {
      iVar50 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSubstringAfterFunction",
             (ulong)(uint)(iVar50 - iVar49));
      iVar48 = iVar48 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar49 = 0;
  do {
    iVar50 = xmlMemBlocks();
    xmlXPathSubstringBeforeFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar51 = xmlMemBlocks();
    if (iVar50 != iVar51) {
      iVar51 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSubstringBeforeFunction",
             (ulong)(uint)(iVar51 - iVar50));
      iVar49 = iVar49 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar50 = 0;
  do {
    iVar51 = xmlMemBlocks();
    xmlXPathSubstringFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar52 = xmlMemBlocks();
    if (iVar51 != iVar52) {
      iVar52 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSubstringFunction",(ulong)(uint)(iVar52 - iVar51));
      iVar50 = iVar50 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar51 = 0;
  do {
    iVar52 = xmlMemBlocks();
    xmlXPathSumFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar53 = xmlMemBlocks();
    if (iVar52 != iVar53) {
      iVar53 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSumFunction",(ulong)(uint)(iVar53 - iVar52));
      iVar51 = iVar51 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar52 = xmlMemBlocks();
  uVar72 = xmlXPathTrailing(0,0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar53 = xmlMemBlocks();
  if (iVar52 != iVar53) {
    iVar54 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathTrailing",(ulong)(uint)(iVar54 - iVar52));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar54 = xmlMemBlocks();
  uVar72 = xmlXPathTrailingSorted(0,0);
  xmlXPathFreeNodeSet(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar55 = xmlMemBlocks();
  if (iVar54 != iVar55) {
    iVar58 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathTrailingSorted",(ulong)(uint)(iVar58 - iVar54));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar58 = 0;
  do {
    iVar59 = xmlMemBlocks();
    xmlXPathTranslateFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar60 = xmlMemBlocks();
    if (iVar59 != iVar60) {
      iVar60 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathTranslateFunction",(ulong)(uint)(iVar60 - iVar59));
      iVar58 = iVar58 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  puVar88 = &DAT_00158240;
  uVar82 = 0;
  iVar59 = 0;
  do {
    iVar60 = xmlMemBlocks();
    xmlXPathTrueFunction(0,*puVar88);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar61 = xmlMemBlocks();
    if (iVar60 != iVar61) {
      iVar61 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathTrueFunction",(ulong)(uint)(iVar61 - iVar60));
      iVar59 = iVar59 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar88 = puVar88 + 1;
  } while (uVar82 != 4);
  function_tests = function_tests + 1;
  iVar60 = xmlMemBlocks();
  xmlXPathValueFlipSign(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar61 = xmlMemBlocks();
  if (iVar60 != iVar61) {
    iVar62 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathValueFlipSign",(ulong)(uint)(iVar62 - iVar60));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar92 = &DAT_0015ad60;
  uVar82 = 0;
  iVar62 = 0;
  do {
    iVar63 = xmlMemBlocks();
    if (uVar82 < 4) {
      uVar72 = *puVar92;
    }
    else {
      uVar72 = 0;
    }
    xmlXPathVariableLookup(0,uVar72);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar64 = xmlMemBlocks();
    if (iVar63 != iVar64) {
      iVar64 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathVariableLookup",(ulong)(uint)(iVar64 - iVar63));
      iVar62 = iVar62 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar82 = uVar82 + 1;
    puVar92 = puVar92 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  iVar63 = 0;
  uVar82 = 0;
  do {
    puVar92 = &DAT_0015ad60;
    uVar83 = 0;
    do {
      iVar64 = xmlMemBlocks();
      if (uVar82 < 4) {
        uVar72 = (&DAT_0015ad60)[uVar82];
      }
      else {
        uVar72 = 0;
      }
      if (uVar83 < 4) {
        uVar79 = *puVar92;
      }
      else {
        uVar79 = 0;
      }
      xmlXPathVariableLookupNS(0,uVar72,uVar79);
      xmlXPathFreeObject();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar65 = xmlMemBlocks();
      if (iVar64 != iVar65) {
        iVar65 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathVariableLookupNS",(ulong)(uint)(iVar65 - iVar64))
        ;
        iVar63 = iVar63 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar82);
        printf(" %d");
        putchar(10);
      }
      uVar83 = uVar83 + 1;
      puVar92 = puVar92 + 1;
    } while (uVar83 != 5);
    uVar82 = uVar82 + 1;
  } while (uVar82 != 5);
  function_tests = function_tests + 1;
  iVar64 = xmlMemBlocks();
  uVar72 = xmlXPathWrapCString(0);
  xmlXPathFreeObject(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar65 = xmlMemBlocks();
  if (iVar64 != iVar65) {
    iVar66 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathWrapCString",(ulong)(uint)(iVar66 - iVar64));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar82 = 0;
  iVar66 = 0;
  bVar1 = true;
  do {
    bVar87 = bVar1;
    iVar67 = xmlMemBlocks();
    xmlXPathWrapExternal(0);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar68 = xmlMemBlocks();
    if (iVar67 != iVar68) {
      iVar68 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathWrapExternal",(ulong)(uint)(iVar68 - iVar67));
      iVar66 = iVar66 + 1;
      printf(" %d",(ulong)uVar82);
      putchar(10);
    }
    uVar82 = 1;
    bVar1 = false;
  } while (bVar87);
  function_tests = function_tests + 1;
  iVar67 = xmlMemBlocks();
  uVar72 = xmlXPathWrapNodeSet(0);
  xmlXPathFreeObject(uVar72);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar68 = xmlMemBlocks();
  if (iVar67 != iVar68) {
    iVar69 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathWrapNodeSet",(ulong)(uint)(iVar69 - iVar67));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar69 = 0;
  uVar82 = 0;
  do {
    uVar83 = 0;
    do {
      iVar84 = 0;
      puVar88 = &DAT_00158240;
      do {
        iVar70 = xmlMemBlocks();
        if (uVar82 < 7) {
          uVar72 = (&DAT_0015ad80)[uVar82];
        }
        else {
          uVar72 = 0;
        }
        uVar85 = 0xffffffff;
        if (uVar83 < 4) {
          uVar85 = (&DAT_00158240)[uVar83];
        }
        xmlXPatherror(0,uVar72,uVar85,*puVar88);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar71 = xmlMemBlocks();
        if (iVar70 != iVar71) {
          iVar71 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPatherror",(ulong)(uint)(iVar71 - iVar70));
          iVar69 = iVar69 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar82);
          printf(" %d",(ulong)uVar83);
          printf(" %d");
          putchar(10);
        }
        iVar84 = iVar84 + 1;
        puVar88 = puVar88 + 1;
      } while (iVar84 != 4);
      uVar83 = uVar83 + 1;
    } while (uVar83 != 4);
    uVar82 = uVar82 + 1;
  } while (uVar82 != 8);
  function_tests = function_tests + 1;
  uVar82 = local_4c + local_40 +
           iVar10 + iVar11 +
           iVar3 + iVar4 + iVar2 + iVar56 + iVar57 + (uint)(iVar5 != iVar6) + iVar7 +
           (uint)(iVar8 != iVar9) + iVar12 + (uint)(iVar13 != iVar14) + iVar15 + iVar90 + iVar16 +
           (uint)(iVar17 != iVar18) + (uint)(iVar19 != iVar20) + (uint)(iVar21 != iVar22) +
           (uint)(iVar23 != iVar24) + (uint)(iVar25 != iVar26) + (uint)(iVar27 != iVar28) +
           (uint)(iVar29 != iVar30) + iVar32 + (uint)(iVar31 != iVar33) + local_50 +
           (uint)(iVar34 != iVar35) + (uint)(iVar36 != iVar37) + (uint)(iVar38 != iVar39) +
           (uint)(iVar40 != iVar41) + iVar80 + iVar42 + iVar43 + iVar44 + iVar45 +
           (uint)(iVar46 != iVar47) + iVar48 + iVar49 + iVar50 + iVar51 + (uint)(iVar52 != iVar53) +
           (uint)(iVar54 != iVar55) + iVar58 + iVar59 + (uint)(iVar60 != iVar61) + iVar62 + iVar63 +
           (uint)(iVar64 != iVar65) + iVar66 + (uint)(iVar67 != iVar68) + iVar69;
  if (uVar82 != 0) {
    printf("Module xpathInternals: %d errors\n",(ulong)uVar82);
  }
  return uVar82;
}

Assistant:

static int
test_xpathInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpathInternals : 106 of 117 functions ...\n");
    test_ret += test_valuePop();
    test_ret += test_valuePush();
    test_ret += test_xmlXPathAddValues();
    test_ret += test_xmlXPathBooleanFunction();
    test_ret += test_xmlXPathCeilingFunction();
    test_ret += test_xmlXPathCompareValues();
    test_ret += test_xmlXPathConcatFunction();
    test_ret += test_xmlXPathContainsFunction();
    test_ret += test_xmlXPathCountFunction();
    test_ret += test_xmlXPathDebugDumpCompExpr();
    test_ret += test_xmlXPathDebugDumpObject();
    test_ret += test_xmlXPathDifference();
    test_ret += test_xmlXPathDistinct();
    test_ret += test_xmlXPathDistinctSorted();
    test_ret += test_xmlXPathDivValues();
    test_ret += test_xmlXPathEqualValues();
    test_ret += test_xmlXPathErr();
    test_ret += test_xmlXPathEvalExpr();
    test_ret += test_xmlXPathEvaluatePredicateResult();
    test_ret += test_xmlXPathFalseFunction();
    test_ret += test_xmlXPathFloorFunction();
    test_ret += test_xmlXPathFunctionLookup();
    test_ret += test_xmlXPathFunctionLookupNS();
    test_ret += test_xmlXPathHasSameNodes();
    test_ret += test_xmlXPathIdFunction();
    test_ret += test_xmlXPathIntersection();
    test_ret += test_xmlXPathIsNodeType();
    test_ret += test_xmlXPathLangFunction();
    test_ret += test_xmlXPathLastFunction();
    test_ret += test_xmlXPathLeading();
    test_ret += test_xmlXPathLeadingSorted();
    test_ret += test_xmlXPathLocalNameFunction();
    test_ret += test_xmlXPathModValues();
    test_ret += test_xmlXPathMultValues();
    test_ret += test_xmlXPathNamespaceURIFunction();
    test_ret += test_xmlXPathNewBoolean();
    test_ret += test_xmlXPathNewCString();
    test_ret += test_xmlXPathNewFloat();
    test_ret += test_xmlXPathNewNodeSet();
    test_ret += test_xmlXPathNewNodeSetList();
    test_ret += test_xmlXPathNewParserContext();
    test_ret += test_xmlXPathNewString();
    test_ret += test_xmlXPathNextAncestor();
    test_ret += test_xmlXPathNextAncestorOrSelf();
    test_ret += test_xmlXPathNextAttribute();
    test_ret += test_xmlXPathNextChild();
    test_ret += test_xmlXPathNextDescendant();
    test_ret += test_xmlXPathNextDescendantOrSelf();
    test_ret += test_xmlXPathNextFollowing();
    test_ret += test_xmlXPathNextFollowingSibling();
    test_ret += test_xmlXPathNextNamespace();
    test_ret += test_xmlXPathNextParent();
    test_ret += test_xmlXPathNextPreceding();
    test_ret += test_xmlXPathNextPrecedingSibling();
    test_ret += test_xmlXPathNextSelf();
    test_ret += test_xmlXPathNodeLeading();
    test_ret += test_xmlXPathNodeLeadingSorted();
    test_ret += test_xmlXPathNodeSetAdd();
    test_ret += test_xmlXPathNodeSetAddNs();
    test_ret += test_xmlXPathNodeSetAddUnique();
    test_ret += test_xmlXPathNodeSetContains();
    test_ret += test_xmlXPathNodeSetDel();
    test_ret += test_xmlXPathNodeSetMerge();
    test_ret += test_xmlXPathNodeSetRemove();
    test_ret += test_xmlXPathNodeSetSort();
    test_ret += test_xmlXPathNodeTrailing();
    test_ret += test_xmlXPathNodeTrailingSorted();
    test_ret += test_xmlXPathNormalizeFunction();
    test_ret += test_xmlXPathNotEqualValues();
    test_ret += test_xmlXPathNotFunction();
    test_ret += test_xmlXPathNsLookup();
    test_ret += test_xmlXPathNumberFunction();
    test_ret += test_xmlXPathParseNCName();
    test_ret += test_xmlXPathParseName();
    test_ret += test_xmlXPathPopBoolean();
    test_ret += test_xmlXPathPopExternal();
    test_ret += test_xmlXPathPopNodeSet();
    test_ret += test_xmlXPathPopNumber();
    test_ret += test_xmlXPathPopString();
    test_ret += test_xmlXPathPositionFunction();
    test_ret += test_xmlXPathRegisterAllFunctions();
    test_ret += test_xmlXPathRegisterFunc();
    test_ret += test_xmlXPathRegisterFuncLookup();
    test_ret += test_xmlXPathRegisterFuncNS();
    test_ret += test_xmlXPathRegisterNs();
    test_ret += test_xmlXPathRegisterVariable();
    test_ret += test_xmlXPathRegisterVariableLookup();
    test_ret += test_xmlXPathRegisterVariableNS();
    test_ret += test_xmlXPathRegisteredFuncsCleanup();
    test_ret += test_xmlXPathRegisteredNsCleanup();
    test_ret += test_xmlXPathRegisteredVariablesCleanup();
    test_ret += test_xmlXPathRoot();
    test_ret += test_xmlXPathRoundFunction();
    test_ret += test_xmlXPathStartsWithFunction();
    test_ret += test_xmlXPathStringEvalNumber();
    test_ret += test_xmlXPathStringFunction();
    test_ret += test_xmlXPathStringLengthFunction();
    test_ret += test_xmlXPathSubValues();
    test_ret += test_xmlXPathSubstringAfterFunction();
    test_ret += test_xmlXPathSubstringBeforeFunction();
    test_ret += test_xmlXPathSubstringFunction();
    test_ret += test_xmlXPathSumFunction();
    test_ret += test_xmlXPathTrailing();
    test_ret += test_xmlXPathTrailingSorted();
    test_ret += test_xmlXPathTranslateFunction();
    test_ret += test_xmlXPathTrueFunction();
    test_ret += test_xmlXPathValueFlipSign();
    test_ret += test_xmlXPathVariableLookup();
    test_ret += test_xmlXPathVariableLookupNS();
    test_ret += test_xmlXPathWrapCString();
    test_ret += test_xmlXPathWrapExternal();
    test_ret += test_xmlXPathWrapNodeSet();
    test_ret += test_xmlXPatherror();

    if (test_ret != 0)
	printf("Module xpathInternals: %d errors\n", test_ret);
    return(test_ret);
}